

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.cpp
# Opt level: O0

uint __thiscall llvm::APInt::countPopulationSlowCase(APInt *this)

{
  uint uVar1;
  uint local_18;
  uint local_14;
  uint i;
  uint Count;
  APInt *this_local;
  
  local_14 = 0;
  local_18 = 0;
  while( true ) {
    uVar1 = getNumWords(this);
    if (uVar1 <= local_18) break;
    uVar1 = countPopulation<unsigned_long>((this->U).pVal[local_18]);
    local_14 = uVar1 + local_14;
    local_18 = local_18 + 1;
  }
  return local_14;
}

Assistant:

unsigned APInt::countPopulationSlowCase() const {
  unsigned Count = 0;
  for (unsigned i = 0; i < getNumWords(); ++i)
    Count += llvm::countPopulation(U.pVal[i]);
  return Count;
}